

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O2

void test_fs_partial(int doread)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  long *__ptr;
  void *__s1;
  uv_loop_t *loop;
  ulong uVar4;
  undefined8 uVar5;
  long *plVar6;
  char *pcVar7;
  void *pvVar8;
  long lVar9;
  int iVar10;
  undefined1 auVar11 [16];
  int pipe_fds [2];
  uv_thread_t thread;
  thread_ctx_conflict ctx;
  uv_signal_t signal;
  
  __ptr = (long *)malloc(0xd4310);
  if (__ptr == (long *)0x0) {
    pcVar7 = "iovs";
    uVar5 = 0xe60;
  }
  else {
    ctx.pid = pthread_self();
    ctx.size = 0xac67d;
    ctx.interval = 1000;
    ctx.doread = doread;
    ctx.data = (char *)malloc(0xac67d);
    if (ctx.data == (char *)0x0) {
      pcVar7 = "ctx.data";
      uVar5 = 0xe67;
    }
    else {
      __s1 = malloc(0xac67d);
      if (__s1 != (void *)0x0) {
        pvVar8 = __s1;
        for (lVar9 = 8; lVar9 != 0xd4318; lVar9 = lVar9 + 0x10) {
          auVar11 = uv_buf_init(pvVar8,0xd);
          *(long *)((long)__ptr + lVar9 + -8) = auVar11._0_8_;
          *(long *)((long)__ptr + lVar9) = auVar11._8_8_;
          pvVar8 = (void *)((long)pvVar8 + 0xd);
        }
        ::loop = (uv_loop_t *)uv_default_loop();
        iVar2 = uv_signal_init(::loop,&signal);
        if (iVar2 == 0) {
          iVar2 = uv_signal_start(&signal,sig_func,10);
          if (iVar2 == 0) {
            iVar2 = pipe(pipe_fds);
            if (iVar2 == 0) {
              ctx.fd = pipe_fds[(uint)doread];
              iVar2 = uv_thread_create(&thread,thread_main);
              if (iVar2 == 0) {
                if (doread == 0) {
                  iVar2 = uv_fs_write(::loop,&write_req,pipe_fds[1],__ptr,0xd431,0xffffffffffffffff,
                                      0);
                  if (write_req.result != iVar2) {
                    pcVar7 = "write_req.result == result";
                    uVar5 = 0xe8e;
                    goto LAB_0012c712;
                  }
                  if (iVar2 != ctx.size) {
                    pcVar7 = "result == ctx.size";
                    uVar5 = 0xe8f;
                    goto LAB_0012c712;
                  }
                  uv_fs_req_cleanup(&write_req);
                }
                else {
                  iVar10 = 0xd431;
                  iVar2 = 0;
                  plVar6 = __ptr;
                  while (iVar2 < ctx.size) {
                    uVar3 = uv_fs_read(::loop,&read_req,pipe_fds[0],plVar6,iVar10,0xffffffffffffffff
                                       ,0);
                    if ((int)uVar3 < 1) {
                      if (uVar3 != 0xfffffffc) {
                        pcVar7 = "result == UV_EINTR";
                        uVar5 = 0xe87;
                        goto LAB_0012c712;
                      }
                    }
                    else {
                      for (uVar4 = (ulong)uVar3; uVar4 != 0; uVar4 = uVar4 - uVar1) {
                        uVar1 = plVar6[1];
                        if (uVar4 <= uVar1 && uVar1 - uVar4 != 0) {
                          *plVar6 = *plVar6 + uVar4;
                          plVar6[1] = uVar1 - uVar4;
                          break;
                        }
                        iVar10 = iVar10 + -1;
                        plVar6 = plVar6 + 2;
                      }
                      iVar2 = iVar2 + uVar3;
                    }
                    uv_fs_req_cleanup(&read_req);
                  }
                }
                iVar2 = bcmp(__s1,ctx.data,(long)ctx.size);
                if (iVar2 == 0) {
                  iVar2 = uv_thread_join(&thread);
                  if (iVar2 == 0) {
                    iVar2 = uv_run(::loop,0);
                    if (iVar2 == 0) {
                      iVar2 = close(pipe_fds[1]);
                      if (iVar2 == 0) {
                        uv_close(&signal,0);
                        iVar2 = uv_fs_read(::loop,&read_req,pipe_fds[0],__ptr,1,0xffffffffffffffff,0
                                          );
                        if (iVar2 == 0) {
                          uv_fs_req_cleanup(&read_req);
                          iVar2 = close(pipe_fds[0]);
                          if (iVar2 == 0) {
                            free(__ptr);
                            free(__s1);
                            free(ctx.data);
                            loop = (uv_loop_t *)uv_default_loop();
                            close_loop(loop);
                            uVar5 = uv_default_loop();
                            iVar2 = uv_loop_close(uVar5);
                            if (iVar2 == 0) {
                              uv_library_shutdown();
                              return;
                            }
                            pcVar7 = "0 == uv_loop_close(uv_default_loop())";
                            uVar5 = 0xea7;
                          }
                          else {
                            pcVar7 = "0 == close(pipe_fds[0])";
                            uVar5 = 0xea1;
                          }
                        }
                        else {
                          pcVar7 = "result == 0";
                          uVar5 = 0xe9e;
                        }
                      }
                      else {
                        pcVar7 = "0 == close(pipe_fds[1])";
                        uVar5 = 0xe98;
                      }
                    }
                    else {
                      pcVar7 = "0 == uv_run(loop, UV_RUN_DEFAULT)";
                      uVar5 = 0xe96;
                    }
                  }
                  else {
                    pcVar7 = "0 == uv_thread_join(&thread)";
                    uVar5 = 0xe95;
                  }
                }
                else {
                  pcVar7 = "0 == memcmp(buffer, ctx.data, ctx.size)";
                  uVar5 = 0xe93;
                }
              }
              else {
                pcVar7 = "0 == uv_thread_create(&thread, thread_main, &ctx)";
                uVar5 = 0xe76;
              }
            }
            else {
              pcVar7 = "0 == pipe(pipe_fds)";
              uVar5 = 0xe73;
            }
          }
          else {
            pcVar7 = "0 == uv_signal_start(&signal, sig_func, SIGUSR1)";
            uVar5 = 0xe71;
          }
        }
        else {
          pcVar7 = "0 == uv_signal_init(loop, &signal)";
          uVar5 = 0xe70;
        }
LAB_0012c712:
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c"
                ,uVar5,pcVar7);
        abort();
      }
      pcVar7 = "buffer";
      uVar5 = 0xe69;
    }
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c",
          uVar5,pcVar7,"!=","NULL",0,"!=",0);
  abort();
}

Assistant:

static void test_fs_partial(int doread) {
  struct thread_ctx ctx;
  uv_thread_t thread;
  uv_signal_t signal;
  int pipe_fds[2];
  size_t iovcount;
  uv_buf_t* iovs;
  char* buffer;
  size_t index;

  iovcount = 54321;

  iovs = malloc(sizeof(*iovs) * iovcount);
  ASSERT_NOT_NULL(iovs);

  ctx.pid = pthread_self();
  ctx.doread = doread;
  ctx.interval = 1000;
  ctx.size = sizeof(test_buf) * iovcount;
  ctx.data = malloc(ctx.size);
  ASSERT_NOT_NULL(ctx.data);
  buffer = malloc(ctx.size);
  ASSERT_NOT_NULL(buffer);

  for (index = 0; index < iovcount; ++index)
    iovs[index] = uv_buf_init(buffer + index * sizeof(test_buf), sizeof(test_buf));

  loop = uv_default_loop();

  ASSERT(0 == uv_signal_init(loop, &signal));
  ASSERT(0 == uv_signal_start(&signal, sig_func, SIGUSR1));

  ASSERT(0 == pipe(pipe_fds));

  ctx.fd = pipe_fds[doread];
  ASSERT(0 == uv_thread_create(&thread, thread_main, &ctx));

  if (doread) {
    uv_buf_t* read_iovs;
    int nread;
    read_iovs = iovs;
    nread = 0;
    while (nread < ctx.size) {
      int result;
      result = uv_fs_read(loop, &read_req, pipe_fds[0], read_iovs, iovcount, -1, NULL);
      if (result > 0) {
        size_t read_iovcount;
        read_iovcount = uv_test_fs_buf_offset(read_iovs, result);
        read_iovs += read_iovcount;
        iovcount -= read_iovcount;
        nread += result;
      } else {
        ASSERT(result == UV_EINTR);
      }
      uv_fs_req_cleanup(&read_req);
    }
  } else {
    int result;
    result = uv_fs_write(loop, &write_req, pipe_fds[1], iovs, iovcount, -1, NULL);
    ASSERT(write_req.result == result);
    ASSERT(result == ctx.size);
    uv_fs_req_cleanup(&write_req);
  }

  ASSERT(0 == memcmp(buffer, ctx.data, ctx.size));

  ASSERT(0 == uv_thread_join(&thread));
  ASSERT(0 == uv_run(loop, UV_RUN_DEFAULT));

  ASSERT(0 == close(pipe_fds[1]));
  uv_close((uv_handle_t*) &signal, NULL);

  { /* Make sure we read everything that we wrote. */
      int result;
      result = uv_fs_read(loop, &read_req, pipe_fds[0], iovs, 1, -1, NULL);
      ASSERT(result == 0);
      uv_fs_req_cleanup(&read_req);
  }
  ASSERT(0 == close(pipe_fds[0]));

  free(iovs);
  free(buffer);
  free(ctx.data);

  MAKE_VALGRIND_HAPPY();
}